

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O1

void __thiscall
p2t::SweepContext::InitEdges
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  pointer ppPVar1;
  Edge *this_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Edge *local_38;
  
  lVar3 = (long)(polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    uVar4 = 0;
    do {
      uVar5 = uVar4 + 1;
      uVar2 = 0;
      if (uVar4 < lVar3 - 1U) {
        uVar2 = uVar5;
      }
      this_00 = (Edge *)operator_new(0x10);
      ppPVar1 = (polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Edge::Edge(this_00,ppPVar1[uVar4],ppPVar1[uVar2]);
      local_38 = this_00;
      std::vector<p2t::Edge*,std::allocator<p2t::Edge*>>::emplace_back<p2t::Edge*>
                ((vector<p2t::Edge*,std::allocator<p2t::Edge*>> *)this,&local_38);
      uVar4 = uVar5;
    } while (lVar3 + (ulong)(lVar3 == 0) != uVar5);
  }
  return;
}

Assistant:

void SweepContext::InitEdges(const std::vector<Point*>& polyline)
{
  size_t num_points = polyline.size();
  for (size_t i = 0; i < num_points; i++) {
    size_t j = i < num_points - 1 ? i + 1 : 0;
    edge_list.push_back(new Edge(*polyline[i], *polyline[j]));
  }
}